

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall
BpTree<int>::Insert_Parent(BpTree<int> *this,IndexNode<int> *C,int k,IndexNode<int> *D)

{
  undefined1 *this_00;
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  IndexNode<int> *pIVar4;
  IndexNode<int> *pIVar5;
  int iVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  bool bVar11;
  IndexNode<int> local_6d8;
  IndexNode<int> local_678;
  IndexNode<int> local_618;
  Addr local_5b8;
  undefined1 local_5b0 [8];
  IndexNode<int> E;
  undefined1 local_548 [4];
  int k2;
  IndexNode<int> Q;
  undefined1 local_4d0 [8];
  Ext_IndexNode<int> T;
  IndexNode<int> local_480;
  IndexNode<int> local_420;
  IndexNode<int> local_3c0;
  Addr local_360;
  undefined1 local_358 [8];
  IndexNode<int> P;
  IndexNode<int> local_298;
  IndexNode<int> local_238;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined1 local_1d0 [8];
  IndexNode<int> R;
  Addr C_Addr;
  int local_100;
  int pos;
  int j;
  int i;
  IndexNode<int> local_88;
  IndexNode<int> *local_28;
  IndexNode<int> *D_local;
  IndexNode<int> *pIStack_18;
  int k_local;
  IndexNode<int> *C_local;
  BpTree<int> *this_local;
  
  local_28 = D;
  D_local._4_4_ = k;
  pIStack_18 = C;
  C_local = (IndexNode<int> *)this;
  IndexNode<int>::IndexNode(&local_88,C);
  LockNode(this,&local_88);
  IndexNode<int>::~IndexNode(&local_88);
  IndexNode<int>::IndexNode((IndexNode<int> *)&j,local_28);
  LockNode(this,(IndexNode<int> *)&j);
  IndexNode<int>::~IndexNode((IndexNode<int> *)&j);
  IndexNode<int>::IndexNode((IndexNode<int> *)&R.self,pIStack_18);
  iVar6 = IsRoot(this,(IndexNode<int> *)&R.self);
  IndexNode<int>::~IndexNode((IndexNode<int> *)&R.self);
  if (iVar6 == 0) {
    IndexNode<int>::IndexNode((IndexNode<int> *)local_358,this->N);
    local_360 = pIStack_18->parent;
    FindNode(this,local_360,(IndexNode<int> *)local_358);
    pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       ((vector<Addr,_std::allocator<Addr>_> *)
                        &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                        (long)(this->N + -1));
    if (pvVar9->FileOff == -1) {
      C_Addr.FileOff = 0;
      while( true ) {
        bVar11 = false;
        if (C_Addr.FileOff < this->N) {
          pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                             ((vector<Addr,_std::allocator<Addr>_> *)
                              &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10,(long)C_Addr.FileOff);
          bVar11 = pvVar9->FileOff != (pIStack_18->self).FileOff;
        }
        if (!bVar11) break;
        C_Addr.FileOff = C_Addr.FileOff + 1;
      }
      pos = 0;
      while( true ) {
        bVar11 = false;
        if (pos < this->N) {
          pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                             ((vector<Addr,_std::allocator<Addr>_> *)
                              &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10,(long)pos);
          bVar11 = pvVar9->FileOff != -1;
        }
        if (!bVar11) break;
        pos = pos + 1;
      }
      for (local_100 = pos; C_Addr.FileOff + 1 < local_100; local_100 = local_100 + -1) {
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)(local_100 + -2));
        vVar1 = *pvVar8;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)(local_100 + -1));
        *pvVar8 = vVar1;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&P,(long)(local_100 + -2));
        vVar2 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&P,(long)(local_100 + -1));
        *pvVar7 = vVar2;
        pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)
                            &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                            (long)(local_100 + -1));
        pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                            ((vector<Addr,_std::allocator<Addr>_> *)
                             &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                             ,(long)local_100);
        *pvVar10 = *pvVar9;
      }
      pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)
                          &P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)C_Addr.FileOff);
      vVar2 = D_local._4_4_;
      *pvVar8 = '1';
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&P,(long)C_Addr.FileOff);
      pIVar4 = local_28;
      *pvVar7 = vVar2;
      pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)
                          &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                          (long)(C_Addr.FileOff + 1));
      iVar6 = (pIVar4->self).FileOff;
      pvVar9->BlockNum = (pIVar4->self).BlockNum;
      pvVar9->FileOff = iVar6;
      local_358[0] = '0';
      local_28->parent = P.parent;
      IndexNode<int>::IndexNode(&local_3c0,pIStack_18);
      UpdateBlock(this,&local_3c0);
      IndexNode<int>::~IndexNode(&local_3c0);
      IndexNode<int>::IndexNode(&local_420,local_28);
      UpdateBlock(this,&local_420);
      IndexNode<int>::~IndexNode(&local_420);
      IndexNode<int>::IndexNode(&local_480,(IndexNode<int> *)local_358);
      UpdateBlock(this,&local_480);
      IndexNode<int>::~IndexNode(&local_480);
      T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
    }
    else {
      Ext_IndexNode<int>::Ext_IndexNode((Ext_IndexNode<int> *)local_4d0,this->N);
      for (pos = 0; pos < this->N + -1; pos = pos + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&P,(long)pos);
        vVar2 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_4d0,(long)pos);
        *pvVar7 = vVar2;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)pos);
        vVar1 = *pvVar8;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &T.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)pos);
        *pvVar8 = vVar1;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)pos);
        *pvVar8 = '0';
        pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)
                            &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                            (long)pos);
        pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                            ((vector<Addr,_std::allocator<Addr>_> *)
                             &T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                             ,(long)pos);
        *pvVar10 = *pvVar9;
        pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)
                            &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                            (long)pos);
        pvVar9->BlockNum = -1;
        pvVar9->FileOff = -1;
      }
      pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)
                          &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                          (long)(this->N + -1));
      pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                          ((vector<Addr,_std::allocator<Addr>_> *)
                           &T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                           (long)(this->N + -1));
      *pvVar10 = *pvVar9;
      pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)
                          &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                          (long)(this->N + -1));
      pvVar9->BlockNum = -1;
      pvVar9->FileOff = -1;
      Q.self.BlockNum = -1;
      Q.self.FileOff = -1;
      pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)
                          &T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                          (long)this->N);
      vVar3.FileOff = Q.self.FileOff;
      vVar3.BlockNum = Q.self.BlockNum;
      *pvVar9 = vVar3;
      C_Addr.FileOff = 0;
      while( true ) {
        bVar11 = false;
        if (C_Addr.FileOff < this->N + 1) {
          pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                             ((vector<Addr,_std::allocator<Addr>_> *)
                              &T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10,(long)C_Addr.FileOff);
          bVar11 = pvVar9->FileOff != (pIStack_18->self).FileOff;
        }
        if (!bVar11) break;
        C_Addr.FileOff = C_Addr.FileOff + 1;
      }
      pos = 0;
      while( true ) {
        bVar11 = false;
        if (pos < this->N + 1) {
          pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                             ((vector<Addr,_std::allocator<Addr>_> *)
                              &T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10,(long)pos);
          bVar11 = pvVar9->FileOff != -1;
        }
        if (!bVar11) break;
        pos = pos + 1;
      }
      for (local_100 = pos; C_Addr.FileOff + 1 < local_100; local_100 = local_100 + -1) {
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &T.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)(local_100 + -2));
        vVar1 = *pvVar8;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &T.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)(local_100 + -1));
        *pvVar8 = vVar1;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_4d0,(long)(local_100 + -2));
        vVar2 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_4d0,(long)(local_100 + -1));
        *pvVar7 = vVar2;
        pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)
                            &T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                            (long)(local_100 + -1));
        pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                            ((vector<Addr,_std::allocator<Addr>_> *)
                             &T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                             ,(long)local_100);
        *pvVar10 = *pvVar9;
      }
      pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)
                          &T.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)C_Addr.FileOff);
      vVar2 = D_local._4_4_;
      *pvVar8 = '1';
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_4d0,(long)C_Addr.FileOff);
      pIVar4 = local_28;
      *pvVar7 = vVar2;
      pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)
                          &T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                          (long)(C_Addr.FileOff + 1));
      iVar6 = (pIVar4->self).FileOff;
      pvVar9->BlockNum = (pIVar4->self).BlockNum;
      pvVar9->FileOff = iVar6;
      IndexNode<int>::IndexNode((IndexNode<int> *)local_548,this->N);
      pos = 0;
      while( true ) {
        iVar6 = min_points_nonleaf(this->N);
        if (iVar6 + -1 <= pos) break;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_4d0,(long)pos);
        vVar2 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&P,(long)pos);
        *pvVar7 = vVar2;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &T.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)pos);
        vVar1 = *pvVar8;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)pos);
        *pvVar8 = vVar1;
        pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)
                            &T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                            (long)pos);
        pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                            ((vector<Addr,_std::allocator<Addr>_> *)
                             &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                             ,(long)pos);
        *pvVar10 = *pvVar9;
        pos = pos + 1;
      }
      pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)
                          &T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                          (long)pos);
      pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                          ((vector<Addr,_std::allocator<Addr>_> *)
                           &P.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                           (long)pos);
      *pvVar10 = *pvVar9;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_4d0,(long)pos);
      E.self.FileOff = *pvVar7;
      while (pos = pos + 1, pos < this->N) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_4d0,(long)pos);
        vVar2 = *pvVar7;
        iVar6 = min_points_nonleaf(this->N);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&Q,(long)(pos - iVar6));
        *pvVar7 = vVar2;
        pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)
                            &T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                            (long)pos);
        iVar6 = min_points_nonleaf(this->N);
        pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                            ((vector<Addr,_std::allocator<Addr>_> *)
                             &Q.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                             ,(long)(pos - iVar6));
        *pvVar10 = *pvVar9;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &T.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)pos);
        vVar1 = *pvVar8;
        iVar6 = min_points_nonleaf(this->N);
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &Q.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)(pos - iVar6));
        *pvVar8 = vVar1;
      }
      pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)
                          &T.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                          (long)pos);
      iVar6 = min_points_nonleaf(this->N);
      pvVar10 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                          ((vector<Addr,_std::allocator<Addr>_> *)
                           &Q.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                           (long)(pos - iVar6));
      *pvVar10 = *pvVar9;
      local_548[0] = '0';
      InsertNode(this,(IndexNode<int> *)local_548);
      pos = 0;
      while( true ) {
        bVar11 = false;
        if (pos < this->N) {
          pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                             ((vector<Addr,_std::allocator<Addr>_> *)
                              &Q.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10,(long)pos);
          bVar11 = pvVar9->FileOff != -1;
        }
        if (!bVar11) break;
        pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)
                            &Q.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                            (long)pos);
        if (pvVar9->FileOff == (pIStack_18->self).FileOff) {
          pIStack_18->parent = Q.parent;
        }
        else {
          IndexNode<int>::IndexNode((IndexNode<int> *)local_5b0,this->N);
          pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                             ((vector<Addr,_std::allocator<Addr>_> *)
                              &Q.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10,(long)pos);
          local_5b8.BlockNum = pvVar9->BlockNum;
          local_5b8.FileOff = pvVar9->FileOff;
          FindNode(this,local_5b8,(IndexNode<int> *)local_5b0);
          E.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)Q.parent;
          IndexNode<int>::IndexNode(&local_618,(IndexNode<int> *)local_5b0);
          UpdateBlock(this,&local_618);
          IndexNode<int>::~IndexNode(&local_618);
          IndexNode<int>::~IndexNode((IndexNode<int> *)local_5b0);
        }
        pos = pos + 1;
      }
      iVar6 = min_points_nonleaf(this->N);
      if (C_Addr.FileOff < iVar6 + -1) {
        local_28->parent = P.parent;
      }
      else {
        local_28->parent = Q.parent;
      }
      IndexNode<int>::IndexNode(&local_678,pIStack_18);
      UpdateBlock(this,&local_678);
      IndexNode<int>::~IndexNode(&local_678);
      IndexNode<int>::IndexNode(&local_6d8,local_28);
      UpdateBlock(this,&local_6d8);
      IndexNode<int>::~IndexNode(&local_6d8);
      Insert_Parent(this,(IndexNode<int> *)local_358,E.self.FileOff,(IndexNode<int> *)local_548);
      IndexNode<int>::~IndexNode((IndexNode<int> *)local_548);
      Ext_IndexNode<int>::~Ext_IndexNode((Ext_IndexNode<int> *)local_4d0);
      T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
    }
    IndexNode<int>::~IndexNode((IndexNode<int> *)local_358);
  }
  else {
    IndexNode<int>::IndexNode((IndexNode<int> *)local_1d0,this->N);
    vVar2 = D_local._4_4_;
    local_1d0[0] = '0';
    local_1d8 = 0xffffffff;
    uStack_1d4 = 0xffffffff;
    R.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0xffffffffffffffff;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&R,0);
    *pvVar7 = vVar2;
    pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)
                        &R.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    pIVar5 = pIStack_18;
    *pvVar8 = '1';
    this_00 = &R.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
    pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       ((vector<Addr,_std::allocator<Addr>_> *)this_00,0);
    pIVar4 = local_28;
    iVar6 = (pIVar5->self).FileOff;
    pvVar9->BlockNum = (pIVar5->self).BlockNum;
    pvVar9->FileOff = iVar6;
    pvVar9 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       ((vector<Addr,_std::allocator<Addr>_> *)this_00,1);
    iVar6 = (pIVar4->self).FileOff;
    pvVar9->BlockNum = (pIVar4->self).BlockNum;
    pvVar9->FileOff = iVar6;
    InsertNode(this,(IndexNode<int> *)local_1d0);
    pIStack_18->parent = R.parent;
    this->RootAddr = R.parent;
    local_28->parent = R.parent;
    IndexNode<int>::IndexNode(&local_238,pIStack_18);
    UpdateBlock(this,&local_238);
    IndexNode<int>::~IndexNode(&local_238);
    IndexNode<int>::IndexNode(&local_298,local_28);
    UpdateBlock(this,&local_298);
    IndexNode<int>::~IndexNode(&local_298);
    IndexNode<int>::IndexNode((IndexNode<int> *)&P.self,(IndexNode<int> *)local_1d0);
    UpdateBlock(this,(IndexNode<int> *)&P.self);
    IndexNode<int>::~IndexNode((IndexNode<int> *)&P.self);
    IndexNode<int>::~IndexNode((IndexNode<int> *)local_1d0);
  }
  return;
}

Assistant:

void BpTree<K>::Insert_Parent(IndexNode<K>& C, K k, IndexNode<K> & D) {
	this->LockNode(C);
	this->LockNode(D);
	int i, j, pos;
	Addr C_Addr = C.self;
	if (this->IsRoot(C)) {
		IndexNode<K> R(N);		//C������Ǹ�
		R.NodeState = INTERNAL;
		R.parent = { -1, -1 };
		R.k[0] = k;
		R.v[0] = '1';
		R.p[0] = C.self;
		R.p[1] = D.self;

		this->InsertNode(R);
		C.parent = R.self;
		this->RootAddr = R.self;
		D.parent = R.self;
		this->UpdateBlock(C);
		this->UpdateBlock(D);
		this->UpdateBlock(R);
		return;
	}
	//C���Ǹ�
	IndexNode<K> P(N);
	this->FindNode(C.parent, P);
	if (P.p[N - 1].FileOff == -1) {
		for (pos = 0; pos < N && P.p[pos].FileOff != C.self.FileOff; pos++);	//P���п�λ
		for (i = 0; i < N && P.p[i].FileOff != -1; i++);
		for (j = i; j > pos + 1; j--) {
			P.v[j - 1] = P.v[j - 2];
			P.k[j - 1] = P.k[j - 2];
			P.p[j] = P.p[j - 1];
		}
		P.v[pos] = '1';
		P.k[pos] = k;
		P.p[pos + 1] = D.self;
		P.NodeState = INTERNAL;
		//C�ĸ���㲻�øı�
		D.parent = P.self;
		this->UpdateBlock(C);
		this->UpdateBlock(D);
		this->UpdateBlock(P);
		return;
	}
	//Pû�п�λ
	Ext_IndexNode<K> T = Ext_IndexNode<K>(N);
	//����P��T�У�˳�����P
	for (i = 0; i < N-1; i++) {
		T.k[i] = P.k[i];
		T.v[i] = P.v[i];	P.v[i] = '0';
		T.p[i] = P.p[i];	P.p[i] = { -1, -1 };
	}
	T.p[N - 1] = P.p[N - 1];	P.p[N - 1] = { -1, -1 };
	T.p[N] = { -1, -1 };
	//�����µ�һ��
	for (pos = 0; pos < N + 1 && T.p[pos].FileOff != C.self.FileOff; pos++);
	for (i = 0; i < N + 1 && T.p[i].FileOff != -1; i++);
	for (j = i; j > pos+1; j--) {
		T.v[j - 1] = T.v[j - 2];
		T.k[j - 1] = T.k[j - 2];
		T.p[j] = T.p[j - 1];
	}
	T.v[pos] = '1';
	T.k[pos] = k;		//pos�ڲ���P�����Ͳ�Ľ��ѡ˭Ϊ�����
	T.p[pos + 1] = D.self;
	IndexNode<K> Q(N);
	//���¶�P��Q��ֵ
	for (i = 0; i < MIN_POINTS_NONLEAF - 1; i++) {
		P.k[i] = T.k[i];
		P.v[i] = T.v[i];
		P.p[i] = T.p[i];
	}
	P.p[i] = T.p[i];	//i == MIN_POINTS_NONLEAF - 1
	K k2 = T.k[i];
	i++;				//i == MIN_POINTS_NONLEAF
	for (; i < N; i++) {
		Q.k[i - MIN_POINTS_NONLEAF] = T.k[i];
		Q.p[i - MIN_POINTS_NONLEAF] = T.p[i];
		Q.v[i - MIN_POINTS_NONLEAF] = T.v[i];
	}
	Q.p[i - MIN_POINTS_NONLEAF] = T.p[i];	//i == N
	Q.NodeState = INTERNAL;
	this->InsertNode(Q);
	//�Գ�ΪQ���ӽ�㣬�����丸����ַ
	for (i = 0; i < N && Q.p[i].FileOff != -1; i++) {
		if (Q.p[i].FileOff == C.self.FileOff) {
			C.parent = Q.self;
		}
		else {
			IndexNode<K> E(N);
			this->FindNode(Q.p[i], E);
			E.parent = Q.self;
			this->UpdateBlock(E);
		}
	}
	if (pos < MIN_POINTS_NONLEAF - 1) {
		D.parent = P.self;
	}
	else {
		D.parent = Q.self;
	}
	this->UpdateBlock(C);
	this->UpdateBlock(D);
	this->Insert_Parent(P, k2, Q);		//�����ݹ�
}